

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

int64_t absl::anon_unknown_8::FloorToUnit(Duration d,Duration unit)

{
  bool bVar1;
  long lVar2;
  Duration DVar3;
  Duration rhs;
  Duration num;
  Duration lhs;
  int64_t local_a8;
  int64_t q;
  Duration rem;
  Duration unit_local;
  Duration d_local;
  
  rem._8_8_ = unit.rep_hi_;
  DVar3.rep_lo_ = unit.rep_lo_;
  Duration::Duration((Duration *)&q);
  DVar3.rep_hi_ = rem._8_8_;
  DVar3._12_4_ = 0;
  num._12_4_ = 0;
  num.rep_hi_ = SUB128(d._0_12_,0);
  num.rep_lo_ = SUB124(d._0_12_,8);
  local_a8 = IDivDuration(num,DVar3,(Duration *)&q);
  if (local_a8 < 1) {
    DVar3 = ZeroDuration();
    lhs.rep_lo_ = (undefined4)rem.rep_hi_;
    lhs.rep_hi_ = q;
    rhs._12_4_ = 0;
    rhs.rep_hi_ = SUB128(DVar3._0_12_,0);
    rhs.rep_lo_ = SUB124(DVar3._0_12_,8);
    lhs._12_4_ = 0;
    bVar1 = operator>=(lhs,rhs);
    if ((!bVar1) && (lVar2 = std::numeric_limits<long>::min(), local_a8 != lVar2)) {
      local_a8 = local_a8 + -1;
    }
  }
  return local_a8;
}

Assistant:

inline int64_t FloorToUnit(absl::Duration d, absl::Duration unit) {
  absl::Duration rem;
  int64_t q = absl::IDivDuration(d, unit, &rem);
  return (q > 0 || rem >= ZeroDuration() ||
          q == std::numeric_limits<int64_t>::min())
             ? q
             : q - 1;
}